

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_tri_collision.cpp
# Opt level: O0

uint __thiscall
GIM_TRIANGLE_CALCULATION_CACHE::clip_triangle
          (GIM_TRIANGLE_CALCULATION_CACHE *this,btVector4 *tri_plane,btVector3 *tripoints,
          btVector3 *srcpoints,btVector3 *clip_points)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  btScalar *pbVar8;
  btVector3 *in_RDX;
  btVector3 *in_RSI;
  float fVar9;
  float fVar10;
  uint _y_2;
  btScalar _x_2;
  btScalar _pp_2;
  btScalar len_2;
  vec3f _dif_2;
  uint _y_1;
  btScalar _x_1;
  btScalar _pp_1;
  btScalar len_1;
  vec3f _dif_1;
  uint clipped_count;
  uint _y;
  btScalar _x;
  btScalar _pp;
  btScalar len;
  vec3f _dif;
  btVector4 edgeplane;
  btVector3 *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  uint in_stack_fffffffffffffe04;
  btScalar polygon_point_count;
  undefined4 in_stack_fffffffffffffe08;
  btScalar bVar11;
  undefined4 in_stack_fffffffffffffe0c;
  btScalar bVar12;
  undefined4 in_stack_fffffffffffffe10;
  btScalar bVar13;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  float local_8c;
  float local_70;
  float local_50;
  btVector3 local_40 [2];
  btVector3 *local_20;
  btVector3 *local_18;
  uint local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  btVector4::btVector4((btVector4 *)0x1e0fdc);
  pbVar8 = btVector3::operator_cast_to_float_(local_20 + 1);
  fVar9 = *pbVar8;
  pbVar8 = btVector3::operator_cast_to_float_(local_20);
  fVar10 = *pbVar8;
  pbVar8 = btVector3::operator_cast_to_float_(local_20 + 1);
  fVar1 = pbVar8[1];
  pbVar8 = btVector3::operator_cast_to_float_(local_20);
  fVar2 = pbVar8[1];
  pbVar8 = btVector3::operator_cast_to_float_(local_20 + 1);
  fVar3 = pbVar8[2];
  pbVar8 = btVector3::operator_cast_to_float_(local_20);
  fVar4 = pbVar8[2];
  pbVar8 = btVector3::operator_cast_to_float_(local_18);
  fVar5 = pbVar8[2];
  pbVar8 = btVector3::operator_cast_to_float_(local_18);
  fVar6 = pbVar8[1];
  pbVar8 = btVector3::operator_cast_to_float_(local_40);
  *pbVar8 = (fVar1 - fVar2) * fVar5 + -((fVar3 - fVar4) * fVar6);
  pbVar8 = btVector3::operator_cast_to_float_(local_18);
  fVar5 = *pbVar8;
  pbVar8 = btVector3::operator_cast_to_float_(local_18);
  fVar6 = pbVar8[2];
  pbVar8 = btVector3::operator_cast_to_float_(local_40);
  pbVar8[1] = (fVar3 - fVar4) * fVar5 + -((fVar9 - fVar10) * fVar6);
  pbVar8 = btVector3::operator_cast_to_float_(local_18);
  fVar3 = pbVar8[1];
  pbVar8 = btVector3::operator_cast_to_float_(local_18);
  fVar4 = *pbVar8;
  pbVar8 = btVector3::operator_cast_to_float_(local_40);
  pbVar8[2] = (fVar9 - fVar10) * fVar3 + -((fVar1 - fVar2) * fVar4);
  pbVar8 = btVector3::operator_cast_to_float_(local_40);
  fVar9 = *pbVar8;
  pbVar8 = btVector3::operator_cast_to_float_(local_40);
  fVar10 = *pbVar8;
  pbVar8 = btVector3::operator_cast_to_float_(local_40);
  fVar1 = pbVar8[1];
  pbVar8 = btVector3::operator_cast_to_float_(local_40);
  fVar2 = pbVar8[1];
  pbVar8 = btVector3::operator_cast_to_float_(local_40);
  fVar3 = pbVar8[2];
  pbVar8 = btVector3::operator_cast_to_float_(local_40);
  fVar9 = fVar3 * pbVar8[2] + fVar9 * fVar10 + fVar1 * fVar2;
  if (1e-07 < fVar9) {
    local_50 = (float)(0x5f3759df - ((uint)fVar9 >> 1));
    local_50 = local_50 * (-(fVar9 * 0.5 * local_50) * local_50 + 1.5);
  }
  else {
    local_50 = 3.4028235e+38;
  }
  if (local_50 < 3.4028235e+38) {
    pbVar8 = btVector3::operator_cast_to_float_(local_40);
    *pbVar8 = local_50 * *pbVar8;
    pbVar8 = btVector3::operator_cast_to_float_(local_40);
    pbVar8[1] = local_50 * pbVar8[1];
    pbVar8 = btVector3::operator_cast_to_float_(local_40);
    pbVar8[2] = local_50 * pbVar8[2];
  }
  pbVar8 = btVector3::operator_cast_to_float_(local_20);
  fVar9 = *pbVar8;
  pbVar8 = btVector3::operator_cast_to_float_(local_40);
  fVar10 = *pbVar8;
  pbVar8 = btVector3::operator_cast_to_float_(local_20);
  fVar1 = pbVar8[1];
  pbVar8 = btVector3::operator_cast_to_float_(local_40);
  fVar2 = pbVar8[1];
  pbVar8 = btVector3::operator_cast_to_float_(local_20);
  fVar3 = pbVar8[2];
  pbVar8 = btVector3::operator_cast_to_float_(local_40);
  fVar4 = pbVar8[2];
  pbVar8 = btVector3::operator_cast_to_float_(local_40);
  pbVar8[3] = fVar3 * fVar4 + fVar9 * fVar10 + fVar1 * fVar2;
  uVar7 = PLANE_CLIP_TRIANGLE3D<btVector3,btVector4>
                    ((btVector4 *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     (btVector3 *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                     (btVector3 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                     (btVector3 *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                     (btVector3 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  if (uVar7 == 0) {
    local_4 = 0;
  }
  else {
    pbVar8 = btVector3::operator_cast_to_float_(local_20 + 2);
    fVar9 = *pbVar8;
    pbVar8 = btVector3::operator_cast_to_float_(local_20 + 1);
    fVar10 = *pbVar8;
    pbVar8 = btVector3::operator_cast_to_float_(local_20 + 2);
    fVar1 = pbVar8[1];
    pbVar8 = btVector3::operator_cast_to_float_(local_20 + 1);
    fVar2 = pbVar8[1];
    pbVar8 = btVector3::operator_cast_to_float_(local_20 + 2);
    fVar3 = pbVar8[2];
    pbVar8 = btVector3::operator_cast_to_float_(local_20 + 1);
    fVar4 = pbVar8[2];
    pbVar8 = btVector3::operator_cast_to_float_(local_18);
    fVar5 = pbVar8[2];
    pbVar8 = btVector3::operator_cast_to_float_(local_18);
    fVar6 = pbVar8[1];
    pbVar8 = btVector3::operator_cast_to_float_(local_40);
    *pbVar8 = (fVar1 - fVar2) * fVar5 + -((fVar3 - fVar4) * fVar6);
    pbVar8 = btVector3::operator_cast_to_float_(local_18);
    fVar5 = *pbVar8;
    pbVar8 = btVector3::operator_cast_to_float_(local_18);
    fVar6 = pbVar8[2];
    pbVar8 = btVector3::operator_cast_to_float_(local_40);
    pbVar8[1] = (fVar3 - fVar4) * fVar5 + -((fVar9 - fVar10) * fVar6);
    pbVar8 = btVector3::operator_cast_to_float_(local_18);
    fVar3 = pbVar8[1];
    pbVar8 = btVector3::operator_cast_to_float_(local_18);
    fVar4 = *pbVar8;
    pbVar8 = btVector3::operator_cast_to_float_(local_40);
    pbVar8[2] = (fVar9 - fVar10) * fVar3 + -((fVar1 - fVar2) * fVar4);
    pbVar8 = btVector3::operator_cast_to_float_(local_40);
    fVar9 = *pbVar8;
    pbVar8 = btVector3::operator_cast_to_float_(local_40);
    fVar10 = *pbVar8;
    pbVar8 = btVector3::operator_cast_to_float_(local_40);
    fVar1 = pbVar8[1];
    pbVar8 = btVector3::operator_cast_to_float_(local_40);
    fVar2 = pbVar8[1];
    pbVar8 = btVector3::operator_cast_to_float_(local_40);
    fVar3 = pbVar8[2];
    pbVar8 = btVector3::operator_cast_to_float_(local_40);
    fVar9 = fVar3 * pbVar8[2] + fVar9 * fVar10 + fVar1 * fVar2;
    if (1e-07 < fVar9) {
      local_70 = (float)(0x5f3759df - ((uint)fVar9 >> 1));
      local_70 = local_70 * (-(fVar9 * 0.5 * local_70) * local_70 + 1.5);
    }
    else {
      local_70 = 3.4028235e+38;
    }
    if (local_70 < 3.4028235e+38) {
      pbVar8 = btVector3::operator_cast_to_float_(local_40);
      *pbVar8 = local_70 * *pbVar8;
      pbVar8 = btVector3::operator_cast_to_float_(local_40);
      pbVar8[1] = local_70 * pbVar8[1];
      pbVar8 = btVector3::operator_cast_to_float_(local_40);
      pbVar8[2] = local_70 * pbVar8[2];
    }
    pbVar8 = btVector3::operator_cast_to_float_(local_20 + 1);
    fVar9 = *pbVar8;
    pbVar8 = btVector3::operator_cast_to_float_(local_40);
    fVar10 = *pbVar8;
    pbVar8 = btVector3::operator_cast_to_float_(local_20 + 1);
    fVar1 = pbVar8[1];
    pbVar8 = btVector3::operator_cast_to_float_(local_40);
    fVar2 = pbVar8[1];
    pbVar8 = btVector3::operator_cast_to_float_(local_20 + 1);
    fVar3 = pbVar8[2];
    pbVar8 = btVector3::operator_cast_to_float_(local_40);
    fVar4 = pbVar8[2];
    pbVar8 = btVector3::operator_cast_to_float_(local_40);
    pbVar8[3] = fVar3 * fVar4 + fVar9 * fVar10 + fVar1 * fVar2;
    uVar7 = PLANE_CLIP_POLYGON3D<btVector3,btVector4>
                      ((btVector4 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                       in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8);
    if (uVar7 == 0) {
      local_4 = 0;
    }
    else {
      pbVar8 = btVector3::operator_cast_to_float_(local_20);
      fVar9 = *pbVar8;
      pbVar8 = btVector3::operator_cast_to_float_(local_20 + 2);
      fVar10 = *pbVar8;
      pbVar8 = btVector3::operator_cast_to_float_(local_20);
      fVar1 = pbVar8[1];
      pbVar8 = btVector3::operator_cast_to_float_(local_20 + 2);
      fVar2 = pbVar8[1];
      pbVar8 = btVector3::operator_cast_to_float_(local_20);
      fVar3 = pbVar8[2];
      pbVar8 = btVector3::operator_cast_to_float_(local_20 + 2);
      fVar4 = pbVar8[2];
      pbVar8 = btVector3::operator_cast_to_float_(local_18);
      fVar5 = pbVar8[2];
      pbVar8 = btVector3::operator_cast_to_float_(local_18);
      fVar6 = pbVar8[1];
      pbVar8 = btVector3::operator_cast_to_float_(local_40);
      *pbVar8 = (fVar1 - fVar2) * fVar5 + -((fVar3 - fVar4) * fVar6);
      pbVar8 = btVector3::operator_cast_to_float_(local_18);
      fVar5 = *pbVar8;
      pbVar8 = btVector3::operator_cast_to_float_(local_18);
      fVar6 = pbVar8[2];
      pbVar8 = btVector3::operator_cast_to_float_(local_40);
      pbVar8[1] = (fVar3 - fVar4) * fVar5 + -((fVar9 - fVar10) * fVar6);
      pbVar8 = btVector3::operator_cast_to_float_(local_18);
      fVar3 = pbVar8[1];
      pbVar8 = btVector3::operator_cast_to_float_(local_18);
      fVar4 = *pbVar8;
      pbVar8 = btVector3::operator_cast_to_float_(local_40);
      pbVar8[2] = (fVar9 - fVar10) * fVar3 + -((fVar1 - fVar2) * fVar4);
      pbVar8 = btVector3::operator_cast_to_float_(local_40);
      fVar9 = *pbVar8;
      pbVar8 = btVector3::operator_cast_to_float_(local_40);
      fVar10 = *pbVar8;
      pbVar8 = btVector3::operator_cast_to_float_(local_40);
      fVar1 = pbVar8[1];
      pbVar8 = btVector3::operator_cast_to_float_(local_40);
      fVar2 = pbVar8[1];
      pbVar8 = btVector3::operator_cast_to_float_(local_40);
      fVar3 = pbVar8[2];
      pbVar8 = btVector3::operator_cast_to_float_(local_40);
      fVar9 = fVar3 * pbVar8[2] + fVar9 * fVar10 + fVar1 * fVar2;
      if (1e-07 < fVar9) {
        local_8c = (float)(0x5f3759df - ((uint)fVar9 >> 1));
        local_8c = local_8c * (-(fVar9 * 0.5 * local_8c) * local_8c + 1.5);
      }
      else {
        local_8c = 3.4028235e+38;
      }
      if (local_8c < 3.4028235e+38) {
        fVar9 = local_8c;
        pbVar8 = btVector3::operator_cast_to_float_(local_40);
        *pbVar8 = fVar9 * *pbVar8;
        fVar9 = local_8c;
        pbVar8 = btVector3::operator_cast_to_float_(local_40);
        pbVar8[1] = fVar9 * pbVar8[1];
        pbVar8 = btVector3::operator_cast_to_float_(local_40);
        pbVar8[2] = local_8c * pbVar8[2];
      }
      pbVar8 = btVector3::operator_cast_to_float_(local_20 + 2);
      bVar11 = *pbVar8;
      pbVar8 = btVector3::operator_cast_to_float_(local_40);
      bVar12 = *pbVar8;
      pbVar8 = btVector3::operator_cast_to_float_(local_20 + 2);
      polygon_point_count = pbVar8[1];
      pbVar8 = btVector3::operator_cast_to_float_(local_40);
      fVar9 = bVar11 * bVar12 + polygon_point_count * pbVar8[1];
      pbVar8 = btVector3::operator_cast_to_float_(local_20 + 2);
      bVar13 = pbVar8[2];
      pbVar8 = btVector3::operator_cast_to_float_(local_40);
      fVar10 = bVar13 * pbVar8[2] + fVar9;
      pbVar8 = btVector3::operator_cast_to_float_(local_40);
      pbVar8[3] = fVar10;
      local_4 = PLANE_CLIP_POLYGON3D<btVector3,btVector4>
                          ((btVector4 *)CONCAT44(fVar9,bVar13),(btVector3 *)CONCAT44(bVar12,bVar11),
                           (uint)polygon_point_count,in_stack_fffffffffffffdf8);
    }
  }
  return local_4;
}

Assistant:

SIMD_FORCE_INLINE GUINT clip_triangle(
		const btVector4 & tri_plane,
		const btVector3 * tripoints,
		const btVector3 * srcpoints,
		btVector3 * clip_points)
	{
		// edge 0

		btVector4 edgeplane;

		EDGE_PLANE(tripoints[0],tripoints[1],tri_plane,edgeplane);

		GUINT clipped_count = PLANE_CLIP_TRIANGLE3D(
			edgeplane,srcpoints[0],srcpoints[1],srcpoints[2],temp_points);

		if(clipped_count == 0) return 0;

		// edge 1

		EDGE_PLANE(tripoints[1],tripoints[2],tri_plane,edgeplane);

		clipped_count = PLANE_CLIP_POLYGON3D(
			edgeplane,temp_points,clipped_count,temp_points1);

		if(clipped_count == 0) return 0;

		// edge 2

		EDGE_PLANE(tripoints[2],tripoints[0],tri_plane,edgeplane);

		clipped_count = PLANE_CLIP_POLYGON3D(
			edgeplane,temp_points1,clipped_count,clip_points);

		return clipped_count;


		/*GUINT i0 = (tri_plane.closestAxis()+1)%3;
		GUINT i1 = (i0+1)%3;
		// edge 0
		btVector3 temp_points[MAX_TRI_CLIPPING];
		btVector3 temp_points1[MAX_TRI_CLIPPING];

		GUINT clipped_count= PLANE_CLIP_TRIANGLE_GENERIC(
			0,srcpoints[0],srcpoints[1],srcpoints[2],temp_points,
			DISTANCE_EDGE(tripoints[0],tripoints[1],i0,i1));
		
		
		if(clipped_count == 0) return 0;

		// edge 1
		clipped_count = PLANE_CLIP_POLYGON_GENERIC(
			0,temp_points,clipped_count,temp_points1,
			DISTANCE_EDGE(tripoints[1],tripoints[2],i0,i1));

		if(clipped_count == 0) return 0;

		// edge 2
		clipped_count = PLANE_CLIP_POLYGON_GENERIC(
			0,temp_points1,clipped_count,clipped_points,
			DISTANCE_EDGE(tripoints[2],tripoints[0],i0,i1));

		return clipped_count;*/
	}